

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> * __thiscall
Catch::TestRegistry::getAllTestsSorted(TestRegistry *this,IConfig *config)

{
  bool bVar1;
  InWhatOrder IVar2;
  InWhatOrder IVar3;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_30;
  IConfig *local_18;
  IConfig *config_local;
  TestRegistry *this_local;
  
  local_18 = config;
  config_local = (IConfig *)this;
  bVar1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::empty
                    (&this->m_sortedFunctions);
  if (bVar1) {
    enforceNoDuplicateTestCases(&this->m_functions);
  }
  IVar3 = this->m_currentSortOrder;
  IVar2 = (*(local_18->super_NonCopyable)._vptr_NonCopyable[0x10])();
  if ((IVar3 != IVar2) ||
     (bVar1 = clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::empty
                        (&this->m_sortedFunctions), bVar1)) {
    sortTests(&local_30,local_18,&this->m_functions);
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::operator=
              (&this->m_sortedFunctions,&local_30);
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_30);
    IVar3 = (*(local_18->super_NonCopyable)._vptr_NonCopyable[0x10])();
    this->m_currentSortOrder = IVar3;
  }
  return &this->m_sortedFunctions;
}

Assistant:

std::vector<TestCase> const& TestRegistry::getAllTestsSorted( IConfig const& config ) const {
        if( m_sortedFunctions.empty() )
            enforceNoDuplicateTestCases( m_functions );

        if(  m_currentSortOrder != config.runOrder() || m_sortedFunctions.empty() ) {
            m_sortedFunctions = sortTests( config, m_functions );
            m_currentSortOrder = config.runOrder();
        }
        return m_sortedFunctions;
    }